

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testCurrentProgPriority
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  Random *rnd;
  GLuint pipeline;
  Pipeline *pPVar1;
  TestLog *pTVar2;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  data;
  _Alloc_hider _Var3;
  bool condition;
  deUint32 seed;
  GLuint GVar4;
  Surface *surface;
  void *__buf;
  undefined4 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7c [12];
  Surface resultSurface;
  Surface refSurface;
  Surface pipelineSurface;
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  program;
  string local_120;
  string local_100;
  LogImage local_e0;
  ProgramParams programPp;
  ProgramParams pipePp;
  
  rnd = &this->m_rnd;
  pipePp = genProgramParams(rnd);
  programPp = genProgramParams(rnd);
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_e0,this,&pipePp);
  local_e0.m_name._M_dataplus._M_p = (pointer)0x0;
  data._4_12_ = in_stack_fffffffffffffe7c;
  data.ptr._0_4_ = in_stack_fffffffffffffe78;
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::operator=(pipeOut,data);
  pPVar1 = (pipeOut->
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           ).m_data.ptr;
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *)&local_e0);
  pipeline = *(GLuint *)
              ((long)(pPVar1->pipeline).
                     super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                     .m_data.ptr + 8);
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)&local_e0,this,&programPp);
  _Var3._M_p = local_e0.m_name._M_dataplus._M_p;
  local_e0.m_name._M_dataplus._M_p = (pointer)0x0;
  program.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)_Var3._M_p;
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniqueBase((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 *)&local_e0);
  tcu::Surface::Surface(&pipelineSurface);
  tcu::Surface::Surface(&refSurface);
  tcu::Surface::Surface(&resultSurface);
  seed = deRandom_getUint32(&rnd->m_rnd);
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,pipeline);
  (this->super_CallLogWrapper).m_enableLog = false;
  drawSurface(this,&pipelineSurface,seed);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = true;
  GVar4 = (*(*(_func_int ***)_Var3._M_p)[2])(_Var3._M_p);
  glu::CallLogWrapper::glUseProgram(this_00,GVar4);
  (this->super_CallLogWrapper).m_enableLog = false;
  drawSurface(this,&refSurface,seed);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = true;
  GVar4 = (*(*(_func_int ***)_Var3._M_p)[2])(_Var3._M_p);
  glu::CallLogWrapper::glUseProgram(this_00,GVar4);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,pipeline);
  (this->super_CallLogWrapper).m_enableLog = false;
  drawSurface(this,&resultSurface,seed);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = false;
  local_e0.m_name._M_dataplus._M_p = local_e0.m_name._M_dataplus._M_p & 0xffffffff00000000;
  condition = tcu::pixelThresholdCompare
                        (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         "Active program rendering result","Active program rendering result",
                         &refSurface,&resultSurface,(RGBA *)&local_e0,COMPARE_LOG_RESULT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"glBindProgramPipeline() affects glUseProgram()",
             (allocator<char> *)&local_120);
  tcu::ResultCollector::check(&this->m_status,condition,&local_e0.m_name);
  std::__cxx11::string::~string((string *)&local_e0);
  if (!condition) {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"Pipeline image",(allocator<char> *)&stack0xfffffffffffffe87);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Image produced by pipeline",
               (allocator<char> *)&stack0xfffffffffffffe86);
    surface = &pipelineSurface;
    tcu::LogImage::LogImage(&local_e0,&local_120,&local_100,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_e0,(int)pTVar2,__buf,(size_t)surface);
    tcu::LogImage::~LogImage(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  tcu::Surface::~Surface(&resultSurface);
  tcu::Surface::~Surface(&refSurface);
  tcu::Surface::~Surface(&pipelineSurface);
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniqueBase(&program.
                 super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               );
  return;
}

Assistant:

void SeparateShaderTest::testCurrentProgPriority (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	ProgramParams				programPp	= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	UniquePtr<ProgramWrapper>	program		(createReferenceProgram(programPp));
	Surface						pipelineSurface;
	Surface						refSurface;
	Surface						resultSurface;
	deUint32					drawSeed	= m_rnd.getUint32();

	LOG_CALL(glBindProgramPipeline(pipeName));
	drawSurface(pipelineSurface, drawSeed);
	LOG_CALL(glBindProgramPipeline(0));

	LOG_CALL(glUseProgram(program->getProgramName()));
	drawSurface(refSurface, drawSeed);
	LOG_CALL(glUseProgram(0));

	LOG_CALL(glUseProgram(program->getProgramName()));
	LOG_CALL(glBindProgramPipeline(pipeName));
	drawSurface(resultSurface, drawSeed);
	LOG_CALL(glBindProgramPipeline(0));
	LOG_CALL(glUseProgram(0));

	bool result = tcu::pixelThresholdCompare(
		m_testCtx.getLog(), "Active program rendering result",
		"Active program rendering result",
		refSurface, resultSurface, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	m_status.check(result, "glBindProgramPipeline() affects glUseProgram()");
	if (!result)
		log() << TestLog::Image("Pipeline image", "Image produced by pipeline",
								pipelineSurface);
}